

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icuid.c
# Opt level: O3

int parse_line(char *line,char *token,uint32_t (*regs) [4],uint32_t limit)

{
  int iVar1;
  size_t __n;
  char *pcVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  char *ex;
  char buf [64];
  char *local_80;
  char local_78 [72];
  
  __n = strlen(token);
  iVar6 = 2;
  if ((line[__n] == '[') && (iVar1 = strncmp(line,token,__n), iVar1 == 0)) {
    strcpy(local_78,line + __n);
    pcVar2 = strtok(local_78,"[ ]");
    iVar6 = 0;
    iVar1 = 0;
    if (pcVar2 != (char *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0;
      uVar4 = strtoul(pcVar2,&local_80,10);
      if ((((local_80 != pcVar2) && (uVar4 <= limit && uVar4 != 0xffffffffffffffff)) &&
          ((iVar6 = iVar1, uVar4 != 0 || (*piVar3 != 0x16)))) &&
         ((pcVar2 = strchr(line,0x3d), pcVar2 != (char *)0x0 &&
          (pcVar2 = strtok(pcVar2 + 1," "), pcVar2 != (char *)0x0)))) {
        uVar7 = 0;
        while( true ) {
          *piVar3 = 0;
          uVar5 = strtoul(pcVar2,&local_80,0x10);
          if (((local_80 == pcVar2) || (uVar5 >> 0x20 != 0)) || ((uVar5 == 0 && (*piVar3 == 0x16))))
          break;
          regs[uVar4][uVar7] = (uint32_t)uVar5;
          pcVar2 = strtok((char *)0x0," ");
          if (2 < uVar7) {
            return 1;
          }
          uVar7 = uVar7 + 1;
          if (pcVar2 == (char *)0x0) {
            return 1;
          }
        }
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

static int parse_line(char *line, const char *token, uint32_t regs[][4],
                      const uint32_t limit)
{
    int i;
    char buf[64];
    char *p, *pp, *ex;
    size_t tokenlen = strlen(token);
    unsigned long level, reg;

    /* Check if our token matches the line */
    p = line + tokenlen;
    if (*p != '[')
        return 2;
    if (strncmp(line, token, tokenlen) != 0)
        return 2;

    /* Since strtok modifies the original buffer we need to make a copy */
    strcpy(buf, p);

    /* Separate the text between the brackets into separate strings */
    p = strtok(buf, "[ ]");
    if (p == NULL)
        return 0;

    errno = 0;
    level = strtoul(p, &ex, 10);
    if (ex == p) {
        return 0;
    } else if (level == ULONG_MAX && errno == ERANGE) {
        return 0;
    } else if (level > limit) {
        return 0;
    } else if ((level == 0 && errno == EINVAL)) {
        return 0;
    }

    /* Get the text after the equals sign */
    p = strchr(line, '=');
    if (p == NULL)
        return 0;
    p += 1;

    /* Separate the text with spaces into separate strings */
    pp = strtok(p, " ");
    if (pp == NULL)
        return 0;

    for (i = 0; i < 4 && pp != NULL; i++) {
        errno = 0;
        reg = strtoul(pp, &ex, 16);
        if (ex == pp) {
            return 0;
        } else if (reg == ULONG_MAX && errno == ERANGE) {
            return 0;
        } else if (reg > 0xFFFFFFFF /* 2^32-1 */) {
            return 0;
        } else if ((reg == 0 && errno == EINVAL)) {
            return 0;
        }
        regs[level][i] = reg;
        pp = strtok(NULL, " "); /* Get next string */
    }

    return 1;
}